

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O0

void QGuiApplicationPrivate::processCloseEvent(CloseEvent *e)

{
  bool bVar1;
  QEvent QVar2;
  QWindowPrivate *pQVar3;
  QWindow *pQVar4;
  QCloseEvent *in_RDI;
  long in_FS_OFFSET;
  QCloseEvent event;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QPointer<QWindow>::isNull((QPointer<QWindow> *)0x36a399);
  if (!bVar1) {
    QPointer<QWindow>::data((QPointer<QWindow> *)0x36a3b2);
    pQVar3 = QWindow::d_func((QWindow *)0x36a3ba);
    if ((pQVar3->blockedByModalWindow & 1U) != 0) {
      QPointer<QWindow>::data((QPointer<QWindow> *)0x36a3d1);
      pQVar3 = QWindow::d_func((QWindow *)0x36a3d9);
      if ((pQVar3->inClose & 1U) == 0) {
        in_RDI[1].super_QEvent = (QEvent)0x0;
        goto LAB_0036a44b;
      }
    }
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QCloseEvent::QCloseEvent(in_RDI);
    pQVar4 = QPointer<QWindow>::data((QPointer<QWindow> *)0x36a41d);
    QCoreApplication::sendSpontaneousEvent((QObject *)pQVar4,(QEvent *)&local_18);
    QVar2 = (QEvent)QEvent::isAccepted((QEvent *)&local_18);
    in_RDI[1].super_QEvent = QVar2;
    QCloseEvent::~QCloseEvent((QCloseEvent *)0x36a44b);
  }
LAB_0036a44b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGuiApplicationPrivate::processCloseEvent(QWindowSystemInterfacePrivate::CloseEvent *e)
{
    if (e->window.isNull())
        return;
    if (e->window.data()->d_func()->blockedByModalWindow && !e->window.data()->d_func()->inClose) {
        // a modal window is blocking this window, don't allow close events through, unless they
        // originate from a call to QWindow::close.
        e->eventAccepted = false;
        return;
    }

    QCloseEvent event;
    QGuiApplication::sendSpontaneousEvent(e->window.data(), &event);

    e->eventAccepted = event.isAccepted();
}